

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void ghc::filesystem::last_write_time(path *p,file_time_type new_time)

{
  bool bVar1;
  int code;
  filesystem_error *this;
  error_code ec_00;
  string local_50;
  duration local_30;
  undefined1 auStack_28 [8];
  error_code ec;
  path *p_local;
  file_time_type new_time_local;
  
  ec._M_cat = (error_category *)p;
  std::error_code::error_code((error_code *)auStack_28);
  local_30 = new_time.__d.__r;
  last_write_time((path *)ec._M_cat,new_time,(error_code *)auStack_28);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_28);
  if (!bVar1) {
    return;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  code = std::error_code::value((error_code *)auStack_28);
  detail::systemErrorText<int>(&local_50,code);
  ec_00._0_8_ = (ulong)auStack_28 & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  filesystem_error::filesystem_error(this,&local_50,(path *)ec._M_cat,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void last_write_time(const path& p, file_time_type new_time)
{
    std::error_code ec;
    last_write_time(p, new_time, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
}